

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intialize.c
# Opt level: O2

void WebRtcIsac_InitPostFilterbank(PostFiltBankstr *postfiltdata)

{
  int k;
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
    postfiltdata->STATE_0_LOWER[lVar1] = 0.0;
    postfiltdata->STATE_0_UPPER[lVar1] = 0.0;
    postfiltdata->STATE_0_LOWER_float[lVar1] = 0.0;
    postfiltdata->STATE_0_UPPER_float[lVar1] = 0.0;
  }
  postfiltdata->HPstates2[0] = 0.0;
  postfiltdata->HPstates2[1] = 0.0;
  postfiltdata->HPstates1[0] = 0.0;
  postfiltdata->HPstates1[1] = 0.0;
  postfiltdata->HPstates1_float[0] = 0.0;
  postfiltdata->HPstates1_float[1] = 0.0;
  postfiltdata->HPstates2_float[0] = 0.0;
  postfiltdata->HPstates2_float[1] = 0.0;
  return;
}

Assistant:

void WebRtcIsac_InitPostFilterbank(PostFiltBankstr *postfiltdata)
{
  int k;

  for (k = 0; k < 2*POSTQORDER; k++) {
    postfiltdata->STATE_0_LOWER[k] = 0;
    postfiltdata->STATE_0_UPPER[k] = 0;

    postfiltdata->STATE_0_LOWER_float[k] = 0;
    postfiltdata->STATE_0_UPPER_float[k] = 0;
  }

  /* High pass filter states */
  postfiltdata->HPstates1[0] = 0.0;
  postfiltdata->HPstates1[1] = 0.0;

  postfiltdata->HPstates2[0] = 0.0;
  postfiltdata->HPstates2[1] = 0.0;

  postfiltdata->HPstates1_float[0] = 0.0f;
  postfiltdata->HPstates1_float[1] = 0.0f;

  postfiltdata->HPstates2_float[0] = 0.0f;
  postfiltdata->HPstates2_float[1] = 0.0f;

  return;
}